

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse2_128_16.c
# Opt level: O0

parasail_result_t *
parasail_sw_striped_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  parasail_matrix_t *ppVar2;
  void *pvVar3;
  longlong lVar4;
  longlong lVar5;
  int6 iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  __m128i *palVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  __m128i *b;
  __m128i *palVar22;
  uint uVar23;
  ulong uVar24;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  __m128i *palVar26;
  undefined4 in_register_00000084;
  longlong lVar27;
  longlong in_R9;
  ushort uVar28;
  ushort uVar31;
  ushort uVar32;
  longlong extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  longlong extraout_XMM0_Qb;
  undefined1 auVar29 [16];
  ushort uVar33;
  ushort uVar37;
  undefined1 auVar30 [16];
  undefined8 extraout_XMM0_Qb_00;
  __m128i c;
  __m128i b_00;
  __m128i b_01;
  __m128i mask;
  __m128i mask_00;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i alVar38;
  int32_t temp;
  int32_t column_len;
  int16_t *t;
  __m128i *pv_2;
  __m128i *pv_1;
  __m128i vCompare;
  __m128i *pv;
  __m128i *vP;
  __m128i vH;
  __m128i vF;
  __m128i vE;
  parasail_result_t *result;
  __m128i insert_mask;
  longlong lStack_468;
  int16_t maxp;
  __m128i vMaxHUnit;
  __m128i vMaxH;
  __m128i vBias;
  int16_t local_42c;
  int16_t score;
  int16_t bias;
  __m128i vZero;
  __m128i vGapE;
  __m128i vGapO;
  __m128i *pvE;
  __m128i *pvHMax;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfile;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  uint local_3b0;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  short local_368;
  short sStack_366;
  short sStack_364;
  short sStack_362;
  short sStack_360;
  short sStack_35e;
  short sStack_35c;
  short sStack_35a;
  short local_358;
  short sStack_356;
  short sStack_354;
  short sStack_352;
  short sStack_350;
  short sStack_34e;
  short sStack_34c;
  short sStack_34a;
  short local_348;
  short sStack_346;
  short sStack_344;
  short sStack_342;
  short sStack_340;
  short sStack_33e;
  short sStack_33c;
  short sStack_33a;
  short local_338;
  short sStack_336;
  short sStack_334;
  short sStack_332;
  short sStack_330;
  short sStack_32e;
  short sStack_32c;
  short sStack_32a;
  short local_208;
  short sStack_206;
  short sStack_204;
  short sStack_202;
  short sStack_200;
  short sStack_1fe;
  short sStack_1fc;
  short sStack_1fa;
  short local_1e8;
  short sStack_1e6;
  short sStack_1e4;
  short sStack_1e2;
  short sStack_1e0;
  short sStack_1de;
  short sStack_1dc;
  short sStack_1da;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short local_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  short sStack_180;
  short sStack_17e;
  short sStack_17c;
  short sStack_17a;
  short local_168;
  short sStack_166;
  short sStack_164;
  short sStack_162;
  short sStack_160;
  short sStack_15e;
  short sStack_15c;
  short sStack_15a;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  size_t len;
  ulong uVar25;
  
  lVar27 = CONCAT44(in_register_00000084,gap);
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_striped_profile_sse2_128_16","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile16).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_striped_profile_sse2_128_16",
            "profile->profile16.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_striped_profile_sse2_128_16","profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_striped_profile_sse2_128_16",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_striped_profile_sse2_128_16","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_striped_profile_sse2_128_16","s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_striped_profile_sse2_128_16","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_striped_profile_sse2_128_16","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    local_3b0 = 0;
    iVar21 = profile->s1Len;
    ppVar2 = profile->matrix;
    iVar19 = (iVar21 + 7) / 8;
    pvVar3 = (profile->profile16).score;
    i._0_2_ = (undefined2)open;
    uVar7 = CONCAT26((undefined2)i,CONCAT24((undefined2)i,CONCAT22((undefined2)i,(undefined2)i)));
    uVar8 = CONCAT26((undefined2)i,CONCAT24((undefined2)i,CONCAT22((undefined2)i,(undefined2)i)));
    j._0_2_ = (undefined2)gap;
    uVar9 = CONCAT26((undefined2)j,CONCAT24((undefined2)j,CONCAT22((undefined2)j,(undefined2)j)));
    uVar10 = CONCAT26((undefined2)j,CONCAT24((undefined2)j,CONCAT22((undefined2)j,(undefined2)j)));
    local_42c = -0x8000;
    lStack_468 = -0x7fff7fff7fff8000;
    vMaxHUnit[0] = -0x7fff7fff7fff8000;
    iVar20 = ppVar2->max;
    profile_local = (parasail_profile_t *)parasail_result_new();
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      uVar23 = *(uint *)&profile_local->field_0xc | 0x8200804;
      len = (size_t)uVar23;
      *(uint *)&profile_local->field_0xc = uVar23;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar19);
      pvHMax = parasail_memalign___m128i(0x10,(long)iVar19);
      pvE = parasail_memalign___m128i(0x10,(long)iVar19);
      b = parasail_memalign___m128i(0x10,(long)iVar19);
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMax == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar38[0] = (long)iVar19;
        alVar38[1] = extraout_RDX;
        parasail_memset___m128i(pvHLoad,alVar38,len);
        c[0] = (long)iVar19;
        c[1] = extraout_RDX_00;
        palVar26 = b;
        parasail_memset___m128i(b,c,len);
        uVar25 = extraout_RDX_01;
        vMaxHUnit[1] = lStack_468;
        vMaxH[0] = vMaxHUnit[0];
        for (end_query = 0; palVar18 = pvHLoad, palVar22 = pvE, end_query < s2Len;
            end_query = end_query + 1) {
          vF[0] = 0x8000800080008000;
          vH[1] = 0x8000800080008000;
          b_00[1] = (long)(iVar19 + -1) * 0x10;
          b_00[0] = uVar25;
          mask[1] = in_R9;
          mask[0] = lVar27;
          a[1] = c[0];
          a[0] = (longlong)palVar26;
          _mm_blendv_epi8_rpl(a,b_00,mask);
          vH[0] = extraout_XMM0_Qb;
          vP = (__m128i *)extraout_XMM0_Qa;
          c[0] = (long)end_query;
          uVar25 = (ulong)(byte)s2[c[0]];
          iVar1 = ppVar2->mapper[uVar25];
          uVar24 = (ulong)(end_query - 2U);
          if (local_3b0 == end_query - 2U) {
            pvE = pvHMax;
            pvHLoad = palVar22;
          }
          else {
            pvHLoad = pvHMax;
          }
          pvHMax = palVar18;
          for (k = 0; k < iVar19; k = k + 1) {
            auVar29 = paddsw((undefined1  [16])_vP,
                             *(undefined1 (*) [16])
                              ((long)pvVar3 + (long)k * 0x10 + (long)(iVar1 * iVar19) * 0x10));
            palVar22 = b + k;
            lVar4 = (*palVar22)[0];
            lVar5 = (*palVar22)[1];
            alVar38 = *palVar22;
            local_138 = auVar29._0_2_;
            sStack_136 = auVar29._2_2_;
            sStack_134 = auVar29._4_2_;
            sStack_132 = auVar29._6_2_;
            sStack_130 = auVar29._8_2_;
            sStack_12e = auVar29._10_2_;
            sStack_12c = auVar29._12_2_;
            sStack_12a = auVar29._14_2_;
            local_148 = (short)lVar4;
            sStack_146 = (short)((ulong)lVar4 >> 0x10);
            sStack_144 = (short)((ulong)lVar4 >> 0x20);
            sStack_142 = (short)((ulong)lVar4 >> 0x30);
            sStack_140 = (short)lVar5;
            sStack_13e = (short)((ulong)lVar5 >> 0x10);
            sStack_13c = (short)((ulong)lVar5 >> 0x20);
            sStack_13a = (short)((ulong)lVar5 >> 0x30);
            uVar28 = (ushort)(local_138 < local_148) * local_148 |
                     (ushort)(local_138 >= local_148) * local_138;
            uVar31 = (ushort)(sStack_136 < sStack_146) * sStack_146 |
                     (ushort)(sStack_136 >= sStack_146) * sStack_136;
            uVar32 = (ushort)(sStack_134 < sStack_144) * sStack_144 |
                     (ushort)(sStack_134 >= sStack_144) * sStack_134;
            uVar33 = (ushort)(sStack_132 < sStack_142) * sStack_142 |
                     (ushort)(sStack_132 >= sStack_142) * sStack_132;
            uVar34 = (ushort)(sStack_130 < sStack_140) * sStack_140 |
                     (ushort)(sStack_130 >= sStack_140) * sStack_130;
            uVar35 = (ushort)(sStack_12e < sStack_13e) * sStack_13e |
                     (ushort)(sStack_12e >= sStack_13e) * sStack_12e;
            uVar36 = (ushort)(sStack_12c < sStack_13c) * sStack_13c |
                     (ushort)(sStack_12c >= sStack_13c) * sStack_12c;
            uVar37 = (ushort)(sStack_12a < sStack_13a) * sStack_13a |
                     (ushort)(sStack_12a >= sStack_13a) * sStack_12a;
            local_168 = (short)vH[1];
            sStack_166 = vH[1]._2_2_;
            sStack_164 = vH[1]._4_2_;
            sStack_162 = vH[1]._6_2_;
            sStack_160 = (short)vH[2];
            sStack_15e = vH[2]._2_2_;
            sStack_15c = vH[2]._4_2_;
            sStack_15a = vH[2]._6_2_;
            uVar28 = (ushort)((short)uVar28 < local_168) * local_168 |
                     ((short)uVar28 >= local_168) * uVar28;
            uVar31 = (ushort)((short)uVar31 < sStack_166) * sStack_166 |
                     ((short)uVar31 >= sStack_166) * uVar31;
            uVar32 = (ushort)((short)uVar32 < sStack_164) * sStack_164 |
                     ((short)uVar32 >= sStack_164) * uVar32;
            uVar33 = (ushort)((short)uVar33 < sStack_162) * sStack_162 |
                     ((short)uVar33 >= sStack_162) * uVar33;
            uVar34 = (ushort)((short)uVar34 < sStack_160) * sStack_160 |
                     ((short)uVar34 >= sStack_160) * uVar34;
            uVar35 = (ushort)((short)uVar35 < sStack_15e) * sStack_15e |
                     ((short)uVar35 >= sStack_15e) * uVar35;
            uVar36 = (ushort)((short)uVar36 < sStack_15c) * sStack_15c |
                     ((short)uVar36 >= sStack_15c) * uVar36;
            uVar37 = (ushort)((short)uVar37 < sStack_15a) * sStack_15a |
                     ((short)uVar37 >= sStack_15a) * uVar37;
            vP._0_4_ = CONCAT22(uVar31,uVar28);
            vP._0_6_ = CONCAT24(uVar32,vP._0_4_);
            vP = (__m128i *)CONCAT26(uVar33,vP._0_6_);
            vH[0]._0_2_ = uVar34;
            vH[0]._2_2_ = uVar35;
            vH[0]._4_2_ = uVar36;
            vH[0]._6_2_ = uVar37;
            pvHLoad[k][0] = (longlong)vP;
            pvHLoad[k][1] = vH[0];
            local_188 = (short)vMaxHUnit[1];
            sStack_186 = (short)((ulong)vMaxHUnit[1] >> 0x10);
            sStack_184 = (short)((ulong)vMaxHUnit[1] >> 0x20);
            sStack_182 = (short)((ulong)vMaxHUnit[1] >> 0x30);
            sStack_180 = (short)vMaxH[0];
            sStack_17e = (short)((ulong)vMaxH[0] >> 0x10);
            sStack_17c = (short)((ulong)vMaxH[0] >> 0x20);
            sStack_17a = (short)((ulong)vMaxH[0] >> 0x30);
            vMaxHUnit[1]._0_4_ =
                 CONCAT22((ushort)((short)uVar31 < sStack_186) * sStack_186 |
                          ((short)uVar31 >= sStack_186) * uVar31,
                          (ushort)((short)uVar28 < local_188) * local_188 |
                          ((short)uVar28 >= local_188) * uVar28);
            vMaxHUnit[1]._0_6_ =
                 CONCAT24((ushort)((short)uVar32 < sStack_184) * sStack_184 |
                          ((short)uVar32 >= sStack_184) * uVar32,(undefined4)vMaxHUnit[1]);
            vMaxHUnit[1] = CONCAT26((ushort)((short)uVar33 < sStack_182) * sStack_182 |
                                    ((short)uVar33 >= sStack_182) * uVar33,(undefined6)vMaxHUnit[1])
            ;
            vMaxH[0]._0_4_ =
                 CONCAT22((ushort)((short)uVar35 < sStack_17e) * sStack_17e |
                          ((short)uVar35 >= sStack_17e) * uVar35,
                          (ushort)((short)uVar34 < sStack_180) * sStack_180 |
                          ((short)uVar34 >= sStack_180) * uVar34);
            vMaxH[0]._0_6_ =
                 CONCAT24((ushort)((short)uVar36 < sStack_17c) * sStack_17c |
                          ((short)uVar36 >= sStack_17c) * uVar36,(undefined4)vMaxH[0]);
            vMaxH[0] = CONCAT26((ushort)((short)uVar37 < sStack_17a) * sStack_17a |
                                ((short)uVar37 >= sStack_17a) * uVar37,(undefined6)vMaxH[0]);
            auVar15._8_8_ = vH[0];
            auVar15._0_8_ = vP;
            auVar14._8_8_ = uVar8;
            auVar14._0_8_ = uVar7;
            auVar29 = psubsw(auVar15,auVar14);
            auVar30._8_8_ = uVar10;
            auVar30._0_8_ = uVar9;
            auVar30 = psubsw((undefined1  [16])alVar38,auVar30);
            local_198 = auVar30._0_2_;
            sStack_196 = auVar30._2_2_;
            sStack_194 = auVar30._4_2_;
            sStack_192 = auVar30._6_2_;
            sStack_190 = auVar30._8_2_;
            sStack_18e = auVar30._10_2_;
            sStack_18c = auVar30._12_2_;
            sStack_18a = auVar30._14_2_;
            local_1a8 = auVar29._0_2_;
            sStack_1a6 = auVar29._2_2_;
            sStack_1a4 = auVar29._4_2_;
            sStack_1a2 = auVar29._6_2_;
            sStack_1a0 = auVar29._8_2_;
            sStack_19e = auVar29._10_2_;
            sStack_19c = auVar29._12_2_;
            sStack_19a = auVar29._14_2_;
            vF[1] = CONCAT26((ushort)(sStack_192 < sStack_1a2) * sStack_1a2 |
                             (ushort)(sStack_192 >= sStack_1a2) * sStack_192,
                             CONCAT24((ushort)(sStack_194 < sStack_1a4) * sStack_1a4 |
                                      (ushort)(sStack_194 >= sStack_1a4) * sStack_194,
                                      CONCAT22((ushort)(sStack_196 < sStack_1a6) * sStack_1a6 |
                                               (ushort)(sStack_196 >= sStack_1a6) * sStack_196,
                                               (ushort)(local_198 < local_1a8) * local_1a8 |
                                               (ushort)(local_198 >= local_1a8) * local_198)));
            vE[0]._0_2_ = (ushort)(sStack_190 < sStack_1a0) * sStack_1a0 |
                          (ushort)(sStack_190 >= sStack_1a0) * sStack_190;
            vE[0]._2_2_ = (ushort)(sStack_18e < sStack_19e) * sStack_19e |
                          (ushort)(sStack_18e >= sStack_19e) * sStack_18e;
            vE[0]._4_2_ = (ushort)(sStack_18c < sStack_19c) * sStack_19c |
                          (ushort)(sStack_18c >= sStack_19c) * sStack_18c;
            vE[0]._6_2_ = (ushort)(sStack_18a < sStack_19a) * sStack_19a |
                          (ushort)(sStack_18a >= sStack_19a) * sStack_18a;
            b[k][0] = vF[1];
            b[k][1] = vE[0];
            auVar29._8_8_ = uVar10;
            auVar29._0_8_ = uVar9;
            auVar29 = psubsw(stack0xfffffffffffffb48,auVar29);
            local_1b8 = auVar29._0_2_;
            sStack_1b6 = auVar29._2_2_;
            sStack_1b4 = auVar29._4_2_;
            sStack_1b2 = auVar29._6_2_;
            sStack_1b0 = auVar29._8_2_;
            sStack_1ae = auVar29._10_2_;
            sStack_1ac = auVar29._12_2_;
            sStack_1aa = auVar29._14_2_;
            vH[1] = CONCAT26((ushort)(sStack_1b2 < sStack_1a2) * sStack_1a2 |
                             (ushort)(sStack_1b2 >= sStack_1a2) * sStack_1b2,
                             CONCAT24((ushort)(sStack_1b4 < sStack_1a4) * sStack_1a4 |
                                      (ushort)(sStack_1b4 >= sStack_1a4) * sStack_1b4,
                                      CONCAT22((ushort)(sStack_1b6 < sStack_1a6) * sStack_1a6 |
                                               (ushort)(sStack_1b6 >= sStack_1a6) * sStack_1b6,
                                               (ushort)(local_1b8 < local_1a8) * local_1a8 |
                                               (ushort)(local_1b8 >= local_1a8) * local_1b8)));
            vF[0]._0_2_ = (ushort)(sStack_1b0 < sStack_1a0) * sStack_1a0 |
                          (ushort)(sStack_1b0 >= sStack_1a0) * sStack_1b0;
            vF[0]._2_2_ = (ushort)(sStack_1ae < sStack_19e) * sStack_19e |
                          (ushort)(sStack_1ae >= sStack_19e) * sStack_1ae;
            vF[0]._4_2_ = (ushort)(sStack_1ac < sStack_19c) * sStack_19c |
                          (ushort)(sStack_1ac >= sStack_19c) * sStack_1ac;
            vF[0]._6_2_ = (ushort)(sStack_1aa < sStack_19a) * sStack_19a |
                          (ushort)(sStack_1aa >= sStack_19a) * sStack_1aa;
            uVar24 = (long)k * 0x10;
            _vP = palVar18[k];
          }
          for (end_ref = 0; end_ref < 8; end_ref = end_ref + 1) {
            b_01[1] = uVar24;
            b_01[0] = uVar25;
            mask_00[1] = in_R9;
            mask_00[0] = lVar27;
            a_00[1] = c[0];
            a_00[0] = (longlong)palVar26;
            alVar38 = _mm_blendv_epi8_rpl(a_00,b_01,mask_00);
            uVar25 = alVar38[1];
            vF[0] = extraout_XMM0_Qb_00;
            vH[1] = extraout_XMM0_Qa_00;
            for (k = 0; k < iVar19; k = k + 1) {
              lVar4 = pvHLoad[k][0];
              lVar5 = pvHLoad[k][1];
              local_1d8 = (short)lVar4;
              sStack_1d6 = (short)((ulong)lVar4 >> 0x10);
              sStack_1d4 = (short)((ulong)lVar4 >> 0x20);
              sStack_1d2 = (short)((ulong)lVar4 >> 0x30);
              sStack_1d0 = (short)lVar5;
              sStack_1ce = (short)((ulong)lVar5 >> 0x10);
              sStack_1cc = (short)((ulong)lVar5 >> 0x20);
              sStack_1ca = (short)((ulong)lVar5 >> 0x30);
              local_1e8 = (short)vH[1];
              sStack_1e6 = vH[1]._2_2_;
              sStack_1e4 = vH[1]._4_2_;
              sStack_1e2 = vH[1]._6_2_;
              sStack_1e0 = (short)vH[2];
              sStack_1de = vH[2]._2_2_;
              sStack_1dc = vH[2]._4_2_;
              sStack_1da = vH[2]._6_2_;
              uVar28 = (ushort)(local_1d8 < local_1e8) * local_1e8 |
                       (ushort)(local_1d8 >= local_1e8) * local_1d8;
              uVar31 = (ushort)(sStack_1d6 < sStack_1e6) * sStack_1e6 |
                       (ushort)(sStack_1d6 >= sStack_1e6) * sStack_1d6;
              uVar32 = (ushort)(sStack_1d4 < sStack_1e4) * sStack_1e4 |
                       (ushort)(sStack_1d4 >= sStack_1e4) * sStack_1d4;
              uVar33 = (ushort)(sStack_1d2 < sStack_1e2) * sStack_1e2 |
                       (ushort)(sStack_1d2 >= sStack_1e2) * sStack_1d2;
              uVar34 = (ushort)(sStack_1d0 < sStack_1e0) * sStack_1e0 |
                       (ushort)(sStack_1d0 >= sStack_1e0) * sStack_1d0;
              uVar35 = (ushort)(sStack_1ce < sStack_1de) * sStack_1de |
                       (ushort)(sStack_1ce >= sStack_1de) * sStack_1ce;
              uVar36 = (ushort)(sStack_1cc < sStack_1dc) * sStack_1dc |
                       (ushort)(sStack_1cc >= sStack_1dc) * sStack_1cc;
              uVar37 = (ushort)(sStack_1ca < sStack_1da) * sStack_1da |
                       (ushort)(sStack_1ca >= sStack_1da) * sStack_1ca;
              vP._0_4_ = CONCAT22(uVar31,uVar28);
              vP._0_6_ = CONCAT24(uVar32,vP._0_4_);
              vP = (__m128i *)CONCAT26(uVar33,vP._0_6_);
              vH[0]._0_2_ = uVar34;
              vH[0]._2_2_ = uVar35;
              vH[0]._4_2_ = uVar36;
              vH[0]._6_2_ = uVar37;
              uVar24 = (long)k * 0x10;
              pvHLoad[k][0] = (longlong)vP;
              pvHLoad[k][1] = vH[0];
              local_208 = (short)vMaxHUnit[1];
              sStack_206 = (short)((ulong)vMaxHUnit[1] >> 0x10);
              sStack_204 = (short)((ulong)vMaxHUnit[1] >> 0x20);
              sStack_202 = (short)((ulong)vMaxHUnit[1] >> 0x30);
              sStack_200 = (short)vMaxH[0];
              sStack_1fe = (short)((ulong)vMaxH[0] >> 0x10);
              sStack_1fc = (short)((ulong)vMaxH[0] >> 0x20);
              sStack_1fa = (short)((ulong)vMaxH[0] >> 0x30);
              vMaxHUnit[1]._0_4_ =
                   CONCAT22((ushort)((short)uVar31 < sStack_206) * sStack_206 |
                            ((short)uVar31 >= sStack_206) * uVar31,
                            (ushort)((short)uVar28 < local_208) * local_208 |
                            ((short)uVar28 >= local_208) * uVar28);
              vMaxHUnit[1]._0_6_ =
                   CONCAT24((ushort)((short)uVar32 < sStack_204) * sStack_204 |
                            ((short)uVar32 >= sStack_204) * uVar32,(undefined4)vMaxHUnit[1]);
              vMaxHUnit[1] = CONCAT26((ushort)((short)uVar33 < sStack_202) * sStack_202 |
                                      ((short)uVar33 >= sStack_202) * uVar33,
                                      (undefined6)vMaxHUnit[1]);
              vMaxH[0]._0_4_ =
                   CONCAT22((ushort)((short)uVar35 < sStack_1fe) * sStack_1fe |
                            ((short)uVar35 >= sStack_1fe) * uVar35,
                            (ushort)((short)uVar34 < sStack_200) * sStack_200 |
                            ((short)uVar34 >= sStack_200) * uVar34);
              vMaxH[0]._0_6_ =
                   CONCAT24((ushort)((short)uVar36 < sStack_1fc) * sStack_1fc |
                            ((short)uVar36 >= sStack_1fc) * uVar36,(undefined4)vMaxH[0]);
              vMaxH[0] = CONCAT26((ushort)((short)uVar37 < sStack_1fa) * sStack_1fa |
                                  ((short)uVar37 >= sStack_1fa) * uVar37,(undefined6)vMaxH[0]);
              auVar13._8_8_ = vH[0];
              auVar13._0_8_ = vP;
              auVar12._8_8_ = uVar8;
              auVar12._0_8_ = uVar7;
              auVar29 = psubsw(auVar13,auVar12);
              auVar11._8_8_ = uVar10;
              auVar11._0_8_ = uVar9;
              register0x00001200 = psubsw(stack0xfffffffffffffb48,auVar11);
              local_338 = (short)vH[1];
              sStack_336 = vH[1]._2_2_;
              sStack_334 = vH[1]._4_2_;
              sStack_332 = vH[1]._6_2_;
              sStack_330 = (short)vH[2];
              sStack_32e = vH[2]._2_2_;
              sStack_32c = vH[2]._4_2_;
              sStack_32a = vH[2]._6_2_;
              local_348 = auVar29._0_2_;
              sStack_346 = auVar29._2_2_;
              sStack_344 = auVar29._4_2_;
              sStack_342 = auVar29._6_2_;
              sStack_340 = auVar29._8_2_;
              sStack_33e = auVar29._10_2_;
              sStack_33c = auVar29._12_2_;
              sStack_33a = auVar29._14_2_;
              uVar28 = -(ushort)(sStack_33a < sStack_32a);
              auVar17._2_2_ = -(ushort)(sStack_346 < sStack_336);
              auVar17._0_2_ = -(ushort)(local_348 < local_338);
              auVar17._4_2_ = -(ushort)(sStack_344 < sStack_334);
              auVar17._6_2_ = -(ushort)(sStack_342 < sStack_332);
              auVar17._8_2_ = -(ushort)(sStack_340 < sStack_330);
              auVar17._10_2_ = -(ushort)(sStack_33e < sStack_32e);
              auVar17._12_2_ = -(ushort)(sStack_33c < sStack_32c);
              auVar17._14_2_ = uVar28;
              if ((((((((((((((((auVar17 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar17 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar17 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar17 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar17 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar17 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar17 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar17 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar17 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar17 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar17 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar17 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar17 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar17 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (uVar28 >> 7 & 1) == 0) && sStack_33a >= sStack_32a) goto LAB_005f25e6;
            }
          }
LAB_005f25e6:
          local_358 = (short)vMaxHUnit[1];
          sStack_356 = (short)((ulong)vMaxHUnit[1] >> 0x10);
          sStack_354 = (short)((ulong)vMaxHUnit[1] >> 0x20);
          sStack_352 = (short)((ulong)vMaxHUnit[1] >> 0x30);
          sStack_350 = (short)vMaxH[0];
          sStack_34e = (short)((ulong)vMaxH[0] >> 0x10);
          sStack_34c = (short)((ulong)vMaxH[0] >> 0x20);
          sStack_34a = (short)((ulong)vMaxH[0] >> 0x30);
          local_368 = (short)lStack_468;
          sStack_366 = (short)((ulong)lStack_468 >> 0x10);
          sStack_364 = (short)((ulong)lStack_468 >> 0x20);
          sStack_362 = (short)((ulong)lStack_468 >> 0x30);
          sStack_360 = (short)vMaxHUnit[0];
          sStack_35e = (short)((ulong)vMaxHUnit[0] >> 0x10);
          sStack_35c = (short)((ulong)vMaxHUnit[0] >> 0x20);
          sStack_35a = (short)((ulong)vMaxHUnit[0] >> 0x30);
          uVar28 = -(ushort)(sStack_360 < sStack_350);
          uVar31 = -(ushort)(sStack_35e < sStack_34e);
          uVar32 = -(ushort)(sStack_35a < sStack_34a);
          auVar16._2_2_ = -(ushort)(sStack_366 < sStack_356);
          auVar16._0_2_ = -(ushort)(local_368 < local_358);
          auVar16._4_2_ = -(ushort)(sStack_364 < sStack_354);
          auVar16._6_2_ = -(ushort)(sStack_362 < sStack_352);
          iVar6 = CONCAT24(-(ushort)(sStack_35c < sStack_34c),CONCAT22(uVar31,uVar28));
          auVar16._14_2_ = uVar32;
          auVar16._8_6_ = iVar6;
          if ((((((((((((((((auVar16 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar16 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar16 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar16 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar16 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar16 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar16 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar16 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (uVar28 & 0x80) != 0) || (uVar28 & 0x8000) != 0) || (uVar31 & 0x80) != 0) ||
                 (uVar31 & 0x8000) != 0) || (-(ushort)(sStack_35c < sStack_34c) & 0x80) != 0) ||
               iVar6 != 0) || (uVar32 >> 7 & 1) != 0) || sStack_35a < sStack_34a) {
            a_01[1] = c[0];
            a_01[0] = (longlong)palVar26;
            local_42c = _mm_hmax_epi16_rpl(a_01);
            if ((short)((short)iVar20 + 1U ^ 0x7fff) < local_42c) {
              *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
              break;
            }
            lStack_468 = CONCAT26(local_42c,CONCAT24(local_42c,CONCAT22(local_42c,local_42c)));
            vMaxHUnit[0] = CONCAT26(local_42c,CONCAT24(local_42c,CONCAT22(local_42c,local_42c)));
            local_3b0 = end_query;
            uVar25 = extraout_RDX_02;
          }
        }
        palVar26 = pvE;
        if (local_42c == 0x7fff) {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
        }
        iVar20 = parasail_result_is_saturated((parasail_result_t *)profile_local);
        if (iVar20 == 0) {
          if (local_3b0 == end_query - 1U) {
            pvE = pvHLoad;
            pvHLoad = palVar26;
          }
          else if (local_3b0 == end_query - 2U) {
            pvE = pvHMax;
            pvHMax = palVar26;
          }
          _temp = pvE;
          s1Len = iVar21 + -1;
          for (k = 0; k < iVar19 * 8; k = k + 1) {
            if (((short)(*_temp)[0] == local_42c) &&
               (iVar21 = k / 8 + (k % 8) * iVar19, iVar21 < s1Len)) {
              s1Len = iVar21;
            }
            _temp = (__m128i *)((long)*_temp + 2);
          }
        }
        else {
          local_42c = 0x7fff;
          s1Len = 0;
          local_3b0 = 0;
        }
        *(int *)&profile_local->s1 = local_42c + 0x8000;
        *(int32_t *)((long)&profile_local->s1 + 4) = s1Len;
        profile_local->s1Len = local_3b0;
        parasail_free(b);
        parasail_free(pvE);
        parasail_free(pvHMax);
        parasail_free(pvHLoad);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    int16_t bias = 0;
    int16_t score = 0;
    __m128i vBias;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int16_t maxp = 0;
    __m128i insert_mask;
    /*int16_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    bias = INT16_MIN;
    score = bias;
    vBias = _mm_set1_epi16(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT16_MAX - (int16_t)(matrix->max+1);
    insert_mask = _mm_cmpgt_epi16(
            _mm_set_epi16(0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT16_MAX : (int16_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vBias, segLen);
    parasail_memset___m128i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_slli_si128(pvHStore[segLen - 1], 2);
        vH = _mm_blendv_epi8_rpl(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm_max_epi16(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_blendv_epi8_rpl(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm_max_epi16(vH, vMaxH);
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7) - bias;
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi16_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi16(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT16_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT16_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int16_t *t = (int16_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}